

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  UnitTestImpl *pUVar6;
  uint uVar7;
  TestCase *this;
  TestInfo *test_info;
  long lVar8;
  long lVar9;
  
  iVar3 = UnitTestImpl::failed_test_count(unit_test->impl_);
  if (iVar3 != 0) {
    pUVar6 = unit_test->impl_;
    ppTVar4 = (pUVar6->test_cases_).
              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(pUVar6->test_cases_).
                                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3)) {
      lVar8 = 0;
      do {
        piVar1 = (pUVar6->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((lVar8 < (int)((ulong)((long)(pUVar6->test_case_indices_).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) &&
           (-1 < piVar1[lVar8])) {
          this = ppTVar4[lVar8];
        }
        else {
          this = (TestCase *)0x0;
        }
        if (this->should_run_ == true) {
          iVar3 = TestCase::failed_test_count(this);
          if ((iVar3 != 0) &&
             (ppTVar5 = (this->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             0 < (int)((ulong)((long)(this->test_info_list_).
                                     super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >>
                      3))) {
            lVar9 = 0;
            do {
              piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar7 = 0xffffffff;
              if (lVar9 < (int)((ulong)((long)(this->test_indices_).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish - (long)piVar1) >> 2
                               )) {
                uVar7 = piVar1[lVar9];
              }
              if ((int)uVar7 < 0) {
                test_info = (TestInfo *)0x0;
              }
              else {
                test_info = ppTVar5[uVar7];
              }
              if (test_info->should_run_ == true) {
                bVar2 = TestResult::Failed(&test_info->result_);
                if (bVar2) {
                  ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
                  printf("%s.%s",(this->name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p)
                  ;
                  PrintFullTestCommentIfPresent(test_info);
                  putchar(10);
                }
              }
              lVar9 = lVar9 + 1;
              ppTVar5 = (this->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar9 < (int)((ulong)((long)(this->test_info_list_).
                                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar5) >> 3));
          }
        }
        lVar8 = lVar8 + 1;
        pUVar6 = unit_test->impl_;
        ppTVar4 = (pUVar6->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar8 < (int)((ulong)((long)(pUVar6->test_cases_).
                                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar4) >> 3));
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  if (failed_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    const TestCase& test_case = *unit_test.GetTestCase(i);
    if (!test_case.should_run() || (test_case.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_case.total_test_count(); ++j) {
      const TestInfo& test_info = *test_case.GetTestInfo(j);
      if (!test_info.should_run() || test_info.result()->Passed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_case.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
}